

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O3

time_t time2sub(tm *tmp,_func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *funcp,state *sp,
               int_fast32_t offset,_Bool *okayp,_Bool do_norm_secs)

{
  undefined8 uVar1;
  _Bool _Var2;
  int_fast32_t l_1;
  int year_offset;
  int iVar3;
  int *piVar4;
  tm *ptVar5;
  int *piVar6;
  ulong uVar7;
  uint uVar8;
  undefined3 in_register_00000089;
  int_fast32_t l_3;
  int *piVar9;
  long lVar10;
  uchar *puVar11;
  bool bVar12;
  bool bVar13;
  time_t t;
  tm yourtm;
  time_t newt;
  tm mytm;
  int *local_d0;
  tm local_c8;
  int_fast32_t local_9c;
  ttinfo *local_98;
  _func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *local_90;
  int *local_88;
  uint local_7c;
  ttinfo *local_78;
  long local_70;
  tm local_64;
  uchar *local_40;
  long local_38;
  
  *okayp = false;
  local_c8.tm_isdst = tmp->tm_isdst;
  local_c8.tm_sec = tmp->tm_sec;
  local_c8.tm_min = tmp->tm_min;
  local_c8.tm_hour = tmp->tm_hour;
  local_c8.tm_mday = tmp->tm_mday;
  local_c8.tm_mon = tmp->tm_mon;
  local_c8.tm_year = tmp->tm_year;
  local_c8.tm_wday = tmp->tm_wday;
  local_c8.tm_yday = tmp->tm_yday;
  if (CONCAT31(in_register_00000089,do_norm_secs) != 0) {
    if (local_c8.tm_sec < 0) {
      uVar8 = ~((uint)~local_c8.tm_sec / 0x3c);
    }
    else {
      uVar8 = (uint)local_c8.tm_sec / 0x3c;
    }
    local_c8.tm_sec = uVar8 * -0x3c + local_c8.tm_sec;
    _Var2 = _PDCLIB_increment_overflow(&local_c8.tm_min,uVar8);
    if (_Var2) {
      return -1;
    }
  }
  if ((long)local_c8._0_8_ < 0) {
    uVar8 = ~((uint)~local_c8.tm_min / 0x3c);
  }
  else {
    uVar8 = (uint)local_c8.tm_min / 0x3c;
  }
  local_c8.tm_min = uVar8 * -0x3c + local_c8.tm_min;
  _Var2 = _PDCLIB_increment_overflow(&local_c8.tm_hour,uVar8);
  if (!_Var2) {
    if (local_c8.tm_hour < 0) {
      uVar8 = ~((uint)~local_c8.tm_hour / 0x18);
    }
    else {
      uVar8 = (uint)local_c8.tm_hour / 0x18;
    }
    local_c8.tm_hour = local_c8.tm_hour + uVar8 * -0x18;
    _Var2 = _PDCLIB_increment_overflow(&local_c8.tm_mday,uVar8);
    uVar1 = local_c8._16_8_;
    if (!_Var2) {
      if (local_c8.tm_mon < 0) {
        uVar8 = ~((uint)~local_c8.tm_mon / 0xc);
      }
      else {
        uVar8 = (uint)local_c8.tm_mon / 0xc;
      }
      local_c8.tm_mon = local_c8.tm_mon + uVar8 * -0xc;
      if ((long)uVar1 < 0) {
        if ((int)uVar8 < -0x80000000 - local_c8.tm_year) {
          return -1;
        }
      }
      else if ((int)(local_c8.tm_year ^ 0x7fffffffU) < (int)uVar8) {
        return -1;
      }
      if ((int)(uVar8 + local_c8.tm_year) < 0x7ffff894) {
        year_offset = uVar8 + local_c8.tm_year + 0x76c;
        iVar3 = year_offset;
        local_9c = offset;
        local_90 = funcp;
        if (local_c8.tm_mday < 1) {
          do {
            year_offset = iVar3 + -1;
            iVar3 = _PDCLIB_is_leap(iVar3 + (uint)(1 < local_c8.tm_mon) + -1);
            bVar13 = SCARRY4(local_c8.tm_mday,year_lengths[iVar3]);
            local_c8.tm_mday = local_c8.tm_mday + year_lengths[iVar3];
            iVar3 = year_offset;
          } while (local_c8.tm_mday == 0 || bVar13 != local_c8.tm_mday < 0);
        }
        if (0x16e < (uint)local_c8.tm_mday) {
          do {
            iVar3 = _PDCLIB_is_leap((uint)(1 < local_c8.tm_mon) + year_offset);
            local_c8.tm_mday = local_c8.tm_mday - year_lengths[iVar3];
            if (year_offset == 0x7fffffff) {
              return -1;
            }
            year_offset = year_offset + 1;
          } while (0x16e < local_c8.tm_mday);
        }
        iVar3 = _PDCLIB_is_leap(year_offset);
        while (mon_lengths[iVar3][local_c8.tm_mon] < local_c8.tm_mday) {
          local_c8.tm_mday = local_c8.tm_mday - mon_lengths[iVar3][local_c8.tm_mon];
          bVar13 = 10 < local_c8.tm_mon;
          local_c8.tm_mon = local_c8.tm_mon + 1;
          if (bVar13) {
            local_c8.tm_mon = 0;
            if (year_offset == 0x7fffffff) {
              return -1;
            }
            year_offset = year_offset + 1;
          }
          iVar3 = _PDCLIB_is_leap(year_offset);
        }
        if (-0x7ffff895 < year_offset) {
          local_c8.tm_year = year_offset + -0x76c;
          iVar3 = local_c8.tm_sec;
          local_7c = 0;
          if (0x3b < (uint)local_c8.tm_sec) {
            if (year_offset < 0x7b2) {
              _Var2 = _PDCLIB_increment_overflow(&local_c8.tm_sec,-0x3b);
              if (_Var2) {
                return -1;
              }
              local_7c = local_c8.tm_sec;
              local_c8.tm_sec = 0x3b;
            }
            else {
              local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
              local_7c = iVar3;
            }
          }
          local_98 = (ttinfo *)0x8000000000000000;
          piVar6 = (int *)0x7fffffffffffffff;
          piVar9 = (int *)0x8000000000000000;
          do {
            piVar4 = (int *)((long)piVar6 / 2 + (long)piVar9 / 2);
            local_d0 = piVar9;
            if (((long)piVar9 <= (long)piVar4) && (local_d0 = piVar4, (long)piVar6 < (long)piVar4))
            {
              local_d0 = piVar6;
            }
            ptVar5 = (*local_90)(sp,(time_t *)&local_d0,local_9c,&local_64);
            if (ptVar5 == (tm *)0x0) {
              bVar13 = (long)local_d0 < 0;
              bVar12 = local_d0 == (int *)0x0;
            }
            else {
              if (local_64.tm_year == local_c8.tm_year) {
                iVar3 = local_64.tm_mon - local_c8.tm_mon;
                if (((iVar3 == 0) && (iVar3 = local_64.tm_mday - local_c8.tm_mday, iVar3 == 0)) &&
                   (iVar3 = local_64.tm_hour - local_c8.tm_hour, iVar3 == 0)) {
                  iVar3 = local_64.tm_min - local_c8.tm_min;
                  if (iVar3 == 0) {
                    iVar3 = local_64.tm_sec - local_c8.tm_sec;
                    if (iVar3 == 0) {
                      if ((local_c8.tm_isdst < 0) || (local_64.tm_isdst == local_c8.tm_isdst)) {
LAB_00103a89:
                        local_d0 = (int *)((long)(int)local_7c + (long)local_d0);
                        local_88 = local_d0;
                        ptVar5 = (*local_90)(sp,(time_t *)&local_d0,local_9c,tmp);
                        if (ptVar5 == (tm *)0x0) {
                          return (time_t)local_d0;
                        }
                        *okayp = true;
                        return (time_t)local_d0;
                      }
                      if (sp == (state *)0x0) {
                        return -1;
                      }
                      local_70 = (long)sp->typecnt;
                      if (local_70 < 1) {
                        return -1;
                      }
                      local_78 = sp->ttis;
                      local_40 = sp->types + 0x7c4;
                      do {
                        local_38 = local_70;
                        local_70 = local_70 + -1;
                        if ((local_c8.tm_isdst == (uint)local_78[local_70].isdst) &&
                           (lVar10 = (long)sp->typecnt, 0 < lVar10)) {
                          local_98 = local_78 + local_70;
                          uVar7 = lVar10 + 1;
                          puVar11 = local_40 + lVar10 * 0x10;
                          do {
                            if (local_c8.tm_isdst != (uint)*puVar11) {
                              local_88 = (int *)((long)local_d0 +
                                                ((long)*(int *)(puVar11 + -4) -
                                                (long)local_98->utoff));
                              ptVar5 = (*local_90)(sp,(time_t *)&local_88,local_9c,&local_64);
                              if (((ptVar5 != (tm *)0x0) &&
                                  (iVar3 = tmcomp(&local_64,&local_c8), iVar3 == 0)) &&
                                 (local_64.tm_isdst == local_c8.tm_isdst)) {
                                local_d0 = local_88;
                                goto LAB_00103a89;
                              }
                            }
                            uVar7 = uVar7 - 1;
                            puVar11 = puVar11 + -0x10;
                          } while (1 < uVar7);
                        }
                        if (local_38 < 2) {
                          return -1;
                        }
                      } while( true );
                    }
                  }
                }
              }
              else {
                iVar3 = (uint)(local_c8.tm_year <= local_64.tm_year) * 2 + -1;
              }
              bVar13 = iVar3 < 0;
              bVar12 = iVar3 == 0;
            }
            if (local_d0 == piVar9) {
              if (piVar9 == (int *)0x7fffffffffffffff) {
                return -1;
              }
              local_d0 = (int *)((long)piVar9 + 1);
              piVar4 = local_d0;
            }
            else {
              piVar4 = piVar9;
              if (local_d0 == piVar6) {
                if ((ttinfo *)piVar6 == local_98) {
                  return -1;
                }
                local_d0 = (int *)((long)piVar6 + -1);
                piVar6 = local_d0;
              }
            }
            if ((long)piVar6 < (long)piVar4) {
              return -1;
            }
            piVar9 = local_d0;
            if (!bVar12 && !bVar13) {
              piVar6 = local_d0;
              piVar9 = piVar4;
            }
          } while( true );
        }
      }
    }
  }
  return -1;
}

Assistant:

static time_t time2sub( struct tm * tmp, struct tm *(*funcp)( struct state const *, time_t const *, int_fast32_t, struct tm * ), struct state const * sp, const int_fast32_t offset, bool * okayp, bool do_norm_secs )
{
    int          dir;
    int          i, j;
    int          saved_seconds;
    int_fast32_t li;
    time_t       lo;
    time_t       hi;
    int_fast32_t y;
    time_t       newt;
    time_t       t;
    struct tm    yourtm, mytm;

    *okayp = false;
    yourtm = *tmp;

    if ( do_norm_secs )
    {
        if ( normalize_overflow( &yourtm.tm_min, &yourtm.tm_sec, SECSPERMIN ) )
        {
            return WRONG;
        }
    }

    if ( normalize_overflow( &yourtm.tm_hour, &yourtm.tm_min, MINSPERHOUR ) )
    {
        return WRONG;
    }

    if ( normalize_overflow( &yourtm.tm_mday, &yourtm.tm_hour, HOURSPERDAY ) )
    {
        return WRONG;
    }

    y = yourtm.tm_year;

    if ( normalize_overflow32( &y, &yourtm.tm_mon, MONSPERYEAR ) )
    {
        return WRONG;
    }

    /* Turn y into an actual year number for now.
       It is converted back to an offset from TM_YEAR_BASE later.
    */
    if ( increment_overflow32( &y, TM_YEAR_BASE ) )
    {
        return WRONG;
    }

    while ( yourtm.tm_mday <= 0 )
    {
        if ( increment_overflow32( &y, -1 ) )
        {
            return WRONG;
        }

        li = y + ( 1 < yourtm.tm_mon );
        yourtm.tm_mday += year_lengths[ _PDCLIB_is_leap( li ) ];
    }
    while ( yourtm.tm_mday > DAYSPERLYEAR )
    {
        li = y + ( 1 < yourtm.tm_mon );
        yourtm.tm_mday -= year_lengths[ _PDCLIB_is_leap( li ) ];

        if ( increment_overflow32( &y, 1 ) )
        {
            return WRONG;
        }
    }

    for ( ; ; )
    {
        i = mon_lengths[ _PDCLIB_is_leap( y ) ][ yourtm.tm_mon ];

        if ( yourtm.tm_mday <= i )
        {
            break;
        }

        yourtm.tm_mday -= i;

        if ( ++yourtm.tm_mon >= MONSPERYEAR )
        {
            yourtm.tm_mon = 0;

            if ( increment_overflow32( &y, 1 ) )
            {
                return WRONG;
            }
        }
    }

    if ( increment_overflow32( &y, -TM_YEAR_BASE ) )
    {
        return WRONG;
    }

    if ( ! ( _PDCLIB_INT_MIN <= y && y <= _PDCLIB_INT_MAX ) )
    {
        return WRONG;
    }

    yourtm.tm_year = y;

    if ( yourtm.tm_sec >= 0 && yourtm.tm_sec < SECSPERMIN )
    {
        saved_seconds = 0;
    }
    else if ( y + TM_YEAR_BASE < EPOCH_YEAR )
    {
        /* We can't set tm_sec to 0, because that might push the
           time below the minimum representable time.
           Set tm_sec to 59 instead.
           This assumes that the minimum representable time is
           not in the same minute that a leap second was deleted from,
           which is a safer assumption than using 58 would be.
        */
        if ( _PDCLIB_increment_overflow( &yourtm.tm_sec, 1 - SECSPERMIN ) )
        {
            return WRONG;
        }

        saved_seconds = yourtm.tm_sec;
        yourtm.tm_sec = SECSPERMIN - 1;
    }
    else
    {
        saved_seconds = yourtm.tm_sec;
        yourtm.tm_sec = 0;
    }

    /* Do a binary search (this works whatever time_t's type is). */
    lo = _PDCLIB_TIME_MIN;
    hi = _PDCLIB_TIME_MAX;

    for ( ; ; )
    {
        t = lo / 2 + hi / 2;

        if ( t < lo )
        {
            t = lo;
        }
        else if ( t > hi )
        {
            t = hi;
        }

        if ( ! funcp( sp, &t, offset, &mytm ) )
        {
            /* Assume that t is too extreme to be represented in
               a struct tm; arrange things so that it is less
               extreme on the next pass.
            */
            dir = ( t > 0 ) ? 1 : -1;
        }
        else
        {
            dir = tmcomp( &mytm, &yourtm );
        }

        if ( dir != 0 )
        {
            if ( t == lo )
            {
                if ( t == _PDCLIB_TIME_MAX )
                {
                    return WRONG;
                }

                ++t;
                ++lo;
            }
            else if ( t == hi )
            {
                if ( t == _PDCLIB_TIME_MIN )
                {
                    return WRONG;
                }

                --t;
                --hi;
            }

            if ( lo > hi )
            {
                return WRONG;
            }

            if ( dir > 0 )
            {
                hi = t;
            }
            else
            {
                lo = t;
            }

            continue;
        }

#if defined TM_GMTOFF && ! UNINIT_TRAP
        if ( mytm.TM_GMTOFF != yourtm.TM_GMTOFF
            && ( yourtm.TM_GMTOFF < 0
            ? ( -SECSPERDAY <= yourtm.TM_GMTOFF
               && ( mytm.TM_GMTOFF <=
                   ( SMALLEST ( _PDCLIB_INT_FAST32_MAX, _PDCLIB_LONG_MAX )
                + yourtm.TM_GMTOFF ) ) )
            : ( yourtm.TM_GMTOFF <= SECSPERDAY
               && ( ( BIGGEST ( _PDCLIB_INT_FAST32_MIN, _PDCLIB_LONG_MIN )
                + yourtm.TM_GMTOFF )
                   <= mytm.TM_GMTOFF ) ) ) )
        {
            /* MYTM matches YOURTM except with the wrong UT offset.
               YOURTM.TM_GMTOFF is plausible, so try it instead.
               It's OK if YOURTM.TM_GMTOFF contains uninitialized data,
               since the guess gets checked.
            */
            time_t altt = t;
            int_fast32_t diff = mytm.TM_GMTOFF - yourtm.TM_GMTOFF;

            if ( ! increment_overflow_time( &altt, diff ) )
            {
                struct tm alttm;
                if ( funcp( sp, &altt, offset, &alttm )
                    && alttm.tm_isdst == mytm.tm_isdst
                    && alttm.TM_GMTOFF == yourtm.TM_GMTOFF
                    && tmcomp( &alttm, &yourtm ) == 0 )
                {
                    t = altt;
                    mytm = alttm;
                }
            }
        }
#endif

        if ( yourtm.tm_isdst < 0 || mytm.tm_isdst == yourtm.tm_isdst )
        {
            break;
        }

        /* Right time, wrong type.
           Hunt for right time, right type.
           It's okay to guess wrong since the guess
           gets checked.
        */
        if ( sp == NULL )
        {
            return WRONG;
        }

        for ( i = sp->typecnt - 1; i >= 0; --i )
        {
            if ( sp->ttis[ i ].isdst != yourtm.tm_isdst )
            {
                continue;
            }

            for ( j = sp->typecnt - 1; j >= 0; --j )
            {
                if ( sp->ttis[ j ].isdst == yourtm.tm_isdst )
                {
                    continue;
                }

                newt = ( t + sp->ttis[ j ].utoff - sp->ttis[ i ].utoff );

                if ( ! funcp( sp, &newt, offset, &mytm ) )
                {
                    continue;
                }

                if ( tmcomp( &mytm, &yourtm ) != 0 )
                {
                    continue;
                }

                if ( mytm.tm_isdst != yourtm.tm_isdst )
                {
                    continue;
                }

                /* We have a match. */
                t = newt;
                goto label;
            }
        }

        return WRONG;
    }

label:
    newt = t + saved_seconds;

    if ( ( newt < t ) != ( saved_seconds < 0 ) )
    {
        return WRONG;
    }

    t = newt;

    if ( funcp( sp, &t, offset, tmp ) )
    {
        *okayp = true;
    }

    return t;
}